

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

bool __thiscall re2::DFA::PossibleMatchRange(DFA *this,string *min,string *max,int maxlen)

{
  bool bVar1;
  mapped_type *pmVar2;
  ulong uVar3;
  StringPiece local_170;
  re2 local_160 [32];
  State *local_140;
  State *ns_1;
  byte local_12d;
  int j_1;
  int iStack_128;
  bool extended_1;
  int i_1;
  int j;
  bool extended;
  State *ns;
  int i;
  MutexLock lock;
  State *s;
  StringPiece local_f8;
  StringPiece local_e8;
  undefined1 local_d8 [8];
  SearchParams params;
  undefined1 local_70 [8];
  RWLocker l;
  map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
  previously_visited_states;
  int maxlen_local;
  string *max_local;
  string *min_local;
  DFA *this_local;
  
  bVar1 = ok(this);
  if (bVar1) {
    std::
    map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
    ::map((map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
           *)&l.writing_);
    RWLocker::RWLocker((RWLocker *)local_70,&this->cache_mutex_);
    StringPiece::StringPiece(&local_e8,(char *)0x0);
    StringPiece::StringPiece(&local_f8,(char *)0x0);
    SearchParams::SearchParams((SearchParams *)local_d8,&local_e8,&local_f8,(RWLocker *)local_70);
    params.context.length_._0_1_ = 1;
    bVar1 = AnalyzeSearch(this,(SearchParams *)local_d8);
    if (bVar1) {
      if (params._32_8_ == 1) {
        std::__cxx11::string::operator=((string *)min,"");
        std::__cxx11::string::operator=((string *)max,"");
        this_local._7_1_ = true;
      }
      else if (params._32_8_ == 2) {
        this_local._7_1_ = false;
      }
      else {
        lock.mu_ = (Mutex *)params._32_8_;
        std::__cxx11::string::clear();
        MutexLock::MutexLock((MutexLock *)&stack0xfffffffffffffef0,&this->mutex_);
        ns._4_4_ = 0;
        while ((ns._4_4_ < maxlen &&
               (pmVar2 = std::
                         map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                         ::operator[]((map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                                       *)&l.writing_,(key_type *)&lock),
               *pmVar2 <= PossibleMatchRange::kMaxEltRepetitions))) {
          pmVar2 = std::
                   map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                   ::operator[]((map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                                 *)&l.writing_,(key_type *)&lock);
          *pmVar2 = *pmVar2 + 1;
          _j = RunStateOnByte(this,(State *)lock.mu_,0x100);
          if (_j == (State *)0x0) {
            this_local._7_1_ = false;
            goto LAB_001508f0;
          }
          if ((_j != (State *)0x1) && ((_j == (State *)0x2 || (bVar1 = State::IsMatch(_j), bVar1))))
          break;
          i_1._3_1_ = 0;
          for (iStack_128 = 0; iStack_128 < 0x100; iStack_128 = iStack_128 + 1) {
            _j = RunStateOnByte(this,(State *)lock.mu_,iStack_128);
            if (_j == (State *)0x0) {
              this_local._7_1_ = false;
              goto LAB_001508f0;
            }
            if ((_j == (State *)0x2) || (((State *)0x2 < _j && (0 < _j->ninst_)))) {
              i_1._3_1_ = 1;
              std::__cxx11::string::append((ulong)min,'\x01');
              lock.mu_ = (Mutex *)_j;
              break;
            }
          }
          if ((i_1._3_1_ & 1) == 0) break;
          ns._4_4_ = ns._4_4_ + 1;
        }
        std::
        map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
        ::clear((map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                 *)&l.writing_);
        lock.mu_ = (Mutex *)params._32_8_;
        std::__cxx11::string::clear();
        j_1 = 0;
        while ((j_1 < maxlen &&
               (pmVar2 = std::
                         map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                         ::operator[]((map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                                       *)&l.writing_,(key_type *)&lock),
               *pmVar2 <= PossibleMatchRange::kMaxEltRepetitions))) {
          pmVar2 = std::
                   map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                   ::operator[]((map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                                 *)&l.writing_,(key_type *)&lock);
          *pmVar2 = *pmVar2 + 1;
          local_12d = 0;
          for (ns_1._4_4_ = 0xff; -1 < ns_1._4_4_; ns_1._4_4_ = ns_1._4_4_ + -1) {
            local_140 = RunStateOnByte(this,(State *)lock.mu_,ns_1._4_4_);
            if (local_140 == (State *)0x0) {
              this_local._7_1_ = false;
              goto LAB_001508f0;
            }
            if ((local_140 == (State *)0x2) ||
               (((State *)0x2 < local_140 && (0 < local_140->ninst_)))) {
              local_12d = 1;
              std::__cxx11::string::append((ulong)max,'\x01');
              lock.mu_ = (Mutex *)local_140;
              break;
            }
          }
          if ((local_12d & 1) == 0) {
            this_local._7_1_ = true;
            goto LAB_001508f0;
          }
          j_1 = j_1 + 1;
        }
        StringPiece::StringPiece(&local_170,max);
        PrefixSuccessor_abi_cxx11_(local_160,&local_170);
        std::__cxx11::string::operator=((string *)max,(string *)local_160);
        std::__cxx11::string::~string((string *)local_160);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
LAB_001508f0:
        MutexLock::~MutexLock((MutexLock *)&stack0xfffffffffffffef0);
      }
    }
    else {
      this_local._7_1_ = false;
    }
    RWLocker::~RWLocker((RWLocker *)local_70);
    std::
    map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
    ::~map((map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
            *)&l.writing_);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DFA::PossibleMatchRange(string* min, string* max, int maxlen) {
  if (!ok())
    return false;

  // NOTE: if future users of PossibleMatchRange want more precision when
  // presented with infinitely repeated elements, consider making this a
  // parameter to PossibleMatchRange.
  static int kMaxEltRepetitions = 0;

  // Keep track of the number of times we've visited states previously. We only
  // revisit a given state if it's part of a repeated group, so if the value
  // portion of the map tuple exceeds kMaxEltRepetitions we bail out and set
  // |*max| to |PrefixSuccessor(*max)|.
  //
  // Also note that previously_visited_states[UnseenStatePtr] will, in the STL
  // tradition, implicitly insert a '0' value at first use. We take advantage
  // of that property below.
  map<State*, int> previously_visited_states;

  // Pick out start state for anchored search at beginning of text.
  RWLocker l(&cache_mutex_);
  SearchParams params(NULL, NULL, &l);
  params.anchored = true;
  if (!AnalyzeSearch(&params))
    return false;
  if (params.start == DeadState) {  // No matching strings
    *min = "";
    *max = "";
    return true;
  }
  if (params.start == FullMatchState)  // Every string matches: no max
    return false;

  // The DFA is essentially a big graph rooted at params.start,
  // and paths in the graph correspond to accepted strings.
  // Each node in the graph has potentially 256+1 arrows
  // coming out, one for each byte plus the magic end of
  // text character kByteEndText.

  // To find the smallest possible prefix of an accepted
  // string, we just walk the graph preferring to follow
  // arrows with the lowest bytes possible.  To find the
  // largest possible prefix, we follow the largest bytes
  // possible.

  // The test for whether there is an arrow from s on byte j is
  //    ns = RunStateOnByteUnlocked(s, j);
  //    if (ns == NULL)
  //      return false;
  //    if (ns != DeadState && ns->ninst > 0)
  // The RunStateOnByteUnlocked call asks the DFA to build out the graph.
  // It returns NULL only if the DFA has run out of memory,
  // in which case we can't be sure of anything.
  // The second check sees whether there was graph built
  // and whether it is interesting graph.  Nodes might have
  // ns->ninst == 0 if they exist only to represent the fact
  // that a match was found on the previous byte.

  // Build minimum prefix.
  State* s = params.start;
  min->clear();
  MutexLock lock(&mutex_);
  for (int i = 0; i < maxlen; i++) {
    if (previously_visited_states[s] > kMaxEltRepetitions) {
      VLOG(2) << "Hit kMaxEltRepetitions=" << kMaxEltRepetitions
        << " for state s=" << s << " and min=" << CEscape(*min);
      break;
    }
    previously_visited_states[s]++;

    // Stop if min is a match.
    State* ns = RunStateOnByte(s, kByteEndText);
    if (ns == NULL)  // DFA out of memory
      return false;
    if (ns != DeadState && (ns == FullMatchState || ns->IsMatch()))
      break;

    // Try to extend the string with low bytes.
    bool extended = false;
    for (int j = 0; j < 256; j++) {
      ns = RunStateOnByte(s, j);
      if (ns == NULL)  // DFA out of memory
        return false;
      if (ns == FullMatchState ||
          (ns > SpecialStateMax && ns->ninst_ > 0)) {
        extended = true;
        min->append(1, static_cast<char>(j));
        s = ns;
        break;
      }
    }
    if (!extended)
      break;
  }

  // Build maximum prefix.
  previously_visited_states.clear();
  s = params.start;
  max->clear();
  for (int i = 0; i < maxlen; i++) {
    if (previously_visited_states[s] > kMaxEltRepetitions) {
      VLOG(2) << "Hit kMaxEltRepetitions=" << kMaxEltRepetitions
        << " for state s=" << s << " and max=" << CEscape(*max);
      break;
    }
    previously_visited_states[s] += 1;

    // Try to extend the string with high bytes.
    bool extended = false;
    for (int j = 255; j >= 0; j--) {
      State* ns = RunStateOnByte(s, j);
      if (ns == NULL)
        return false;
      if (ns == FullMatchState ||
          (ns > SpecialStateMax && ns->ninst_ > 0)) {
        extended = true;
        max->append(1, static_cast<char>(j));
        s = ns;
        break;
      }
    }
    if (!extended) {
      // Done, no need for PrefixSuccessor.
      return true;
    }
  }

  // Stopped while still adding to *max - round aaaaaaaaaa... to aaaa...b
  *max = PrefixSuccessor(*max);

  // If there are no bytes left, we have no way to say "there is no maximum
  // string".  We could make the interface more complicated and be able to
  // return "there is no maximum but here is a minimum", but that seems like
  // overkill -- the most common no-max case is all possible strings, so not
  // telling the caller that the empty string is the minimum match isn't a
  // great loss.
  if (max->empty())
    return false;

  return true;
}